

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

int __thiscall
Centaurus::Grammar<wchar_t>::parse(Grammar<wchar_t> *this,char *filename,int machine_id)

{
  wchar_t wVar1;
  int iVar2;
  StreamException *pSVar3;
  wstring *__n;
  wstring grammar_str;
  Stream stream;
  ATNMachine<wchar_t> atn;
  wstring wide_path;
  Encoder enc;
  Identifier id;
  wifstream grammar_file;
  allocator local_3b1;
  undefined1 *local_3b0;
  long local_3a8;
  undefined1 local_3a0 [16];
  Grammar<wchar_t> *local_390;
  undefined1 local_388 [8];
  _Alloc_hider local_380;
  wchar_t local_370 [4];
  iterator local_360;
  undefined8 local_358;
  bool local_350;
  undefined1 local_348 [8];
  undefined1 local_340 [24];
  int local_328;
  undefined **local_320;
  wstring *local_318;
  undefined4 local_310 [2];
  wstring local_308 [16];
  undefined **local_2f8;
  vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_> local_2f0;
  int local_2d8;
  wstring *local_2d0;
  char *local_2c8;
  Identifier *local_2c0;
  vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_> *local_2b8;
  _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_2b0;
  Encoder local_2a8;
  Identifier local_2a0;
  string local_278;
  string local_258;
  long local_238 [29];
  undefined8 auStack_150 [36];
  
  local_390 = this;
  local_2c8 = filename;
  std::wifstream::wifstream(local_238,filename,_S_in);
  local_3b0 = local_3a0;
  std::__cxx11::wstring::_M_construct<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
            ((wstring *)&local_3b0,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  local_380._M_p = local_370;
  local_388 = (undefined1  [8])&PTR__Stream_0019e638;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_380,local_3b0,local_3b0 + local_3a8 * 4);
  local_358._0_4_ = 1;
  local_358._4_4_ = 0;
  local_350 = false;
  __n = (wstring *)&(local_390->m_root_id).m_id;
  local_2b0 = (_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_390->m_networks;
  local_2b8 = &local_390->m_identifiers;
  local_360._M_current = local_380._M_p;
  local_2c0 = &local_390->m_grammar_name;
  local_2d0 = __n;
  do {
    wVar1 = Stream::skip_whitespace((Stream *)local_388);
    if (wVar1 == L'\0') {
      local_388 = (undefined1  [8])&PTR__Stream_0019e638;
      if (local_380._M_p != local_370) {
        operator_delete(local_380._M_p);
      }
      if (local_3b0 != local_3a0) {
        operator_delete(local_3b0);
      }
      std::wifstream::~wifstream(local_238);
      return machine_id;
    }
    if (0xffff < machine_id) {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::toomany(pSVar3,(Stream *)local_388,0xffff);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    Identifier::Identifier(&local_2a0,(Stream *)local_388);
    iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_2a0.m_id);
    if (iVar2 == 0) {
      Stream::skip_whitespace((Stream *)local_388);
      Identifier::parse(local_2c0,(Stream *)local_388);
      wVar1 = Stream::skip_whitespace((Stream *)local_388);
      if (wVar1 != L';') {
        pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar3,(Stream *)local_388,wVar1);
        __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
      }
      Stream::get((Stream *)local_388);
    }
    else {
      iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_2a0.m_id);
      if (iVar2 == 0) {
        wVar1 = Stream::skip_whitespace((Stream *)local_388);
        if (wVar1 != L'\"') {
          pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar3,(Stream *)local_388,wVar1);
          __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::get((Stream *)local_388);
        local_320 = (undefined **)local_310;
        local_318 = (wstring *)0x0;
        local_310[0] = 0;
        while( true ) {
          wVar1 = Stream::get((Stream *)local_388);
          if (wVar1 == L'\"') break;
          std::__cxx11::wstring::push_back((wchar_t)&local_320);
        }
        wVar1 = Stream::skip_whitespace((Stream *)local_388);
        if (wVar1 != L';') {
          pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar3,(Stream *)local_388,wVar1);
          __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::get((Stream *)local_388);
        Encoder::Encoder(&local_2a8);
        std::__cxx11::string::string((string *)&local_278,local_2c8,&local_3b1);
        Encoder::wcstombs((Encoder *)&local_258,(char *)&local_2a8,(wchar_t *)&local_320,(size_t)__n
                         );
        anon_unknown.dwarf_294aa8::make_include_path((string *)local_348,&local_278,&local_258);
        machine_id = parse(local_390,(char *)local_348,machine_id);
        if (local_348 != (undefined1  [8])(local_340 + 8)) {
          operator_delete((void *)local_348);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        if (local_320 != (undefined **)local_310) {
          operator_delete(local_320);
        }
      }
      else {
        ATNMachine<wchar_t>::ATNMachine
                  ((ATNMachine<wchar_t> *)local_348,machine_id,(Stream *)local_388);
        if ((local_390->m_root_id).m_id._M_string_length == 0) {
          std::__cxx11::wstring::_M_assign(local_2d0);
        }
        __n = local_308;
        local_320 = &PTR__Identifier_0019cd38;
        local_318 = __n;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_318,local_2a0.m_id._M_dataplus._M_p,
                   local_2a0.m_id._M_dataplus._M_p + local_2a0.m_id._M_string_length);
        local_2f8 = &PTR__ATNMachine_0019e698;
        local_2f0.
        super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_340._0_8_;
        local_2f0.
        super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_340._8_8_;
        local_2f0.
        super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_340._16_8_;
        local_340._0_16_ = ZEXT816(0) << 0x20;
        local_340._16_8_ = (pointer)0x0;
        local_2d8 = local_328;
        std::
        _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<wchar_t>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<Centaurus::Identifier,Centaurus::ATNMachine<wchar_t>>>
                  (local_2b0,&local_320);
        local_2f8 = &PTR__ATNMachine_0019e698;
        std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
        ~vector(&local_2f0);
        local_320 = &PTR__Identifier_0019cd38;
        if (local_318 != local_308) {
          operator_delete(local_318);
        }
        std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                  (local_2b8,&local_2a0);
        machine_id = machine_id + 1;
        local_348 = (undefined1  [8])&PTR__ATNMachine_0019e698;
        std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
        ~vector((vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                 *)local_340);
      }
    }
    local_2a0._vptr_Identifier = (_func_int **)&PTR__Identifier_0019cd38;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_2a0.m_id._M_dataplus._M_p != &local_2a0.m_id.field_2) {
      operator_delete(local_2a0.m_id._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

int Grammar<TCHAR>::parse(const char *filename, int machine_id)
{
    std::wifstream grammar_file(filename, std::ios::in);

    std::wstring grammar_str(std::istreambuf_iterator<wchar_t>(grammar_file), {});

    Stream stream(std::move(grammar_str));

    while (1)
    {
        wchar_t ch = stream.skip_whitespace();

        if (ch == L'\0')
            break;

        if (machine_id >= 65536)
            throw stream.toomany(65535);

        Identifier id(stream);

        if (id == L"grammar")
        {
            stream.skip_whitespace();

            m_grammar_name.parse(stream);

            wchar_t ch = stream.skip_whitespace();

            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();
        }
        /*else if (id == L"options")
        {
            GrammarOptions options(stream);
        }
		else if (id == L"fragment")
		{
			Identifier frag_id(stream);

			ATNMachine<TCHAR> atn(-1, stream);

			fragments.emplace(frag_id, std::move(atn));
		}*/
        else if (id == L"include")
        {
            wchar_t ch = stream.skip_whitespace();

            if (ch != L'"')
                throw stream.unexpected(ch);
            stream.discard();

            std::wstring wide_path;

            for (ch = stream.get(); ch != L'"'; ch = stream.get())
            {
                wide_path.push_back(ch);
            }

            ch = stream.skip_whitespace();
            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();

            Encoder enc{};

            machine_id = parse(make_include_path(filename, enc.wcstombs(wide_path)), machine_id);
        }
        else
        {
            ATNMachine<TCHAR> atn(machine_id++, stream);

            if (m_root_id.str().empty())
                m_root_id = id;

            m_networks.insert(std::pair<Identifier, ATNMachine<TCHAR> >(id, std::move(atn)));

            m_identifiers.push_back(id);
        }

        //m_networks.emplace(Identifier(stream), ATN<TCHAR>(stream));
    }
    return machine_id;
}